

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O0

void __thiscall cppforth::Forth::fileReposition(Forth *this)

{
  byte bVar1;
  uint uVar2;
  uint valueLo;
  uint valueHi;
  element_type *peVar3;
  ForthStack<unsigned_int> *this_00;
  iostate status;
  allocator<char> local_51;
  string local_50 [32];
  undefined1 local_30 [8];
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> f;
  DCell ud;
  uint h;
  Forth *this_local;
  
  requireDStackDepth(this,3,"REPOSITION-FILE");
  this_00 = &this->dStack;
  uVar2 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  valueLo = ForthStack<unsigned_int>::getTop(this_00,1);
  valueHi = ForthStack<unsigned_int>::getTop(this_00);
  DCell::DCell((DCell *)&f.
                         super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount,valueLo,valueHi);
  ForthStack<unsigned_int>::pop(this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"REPOSITION-FILE",&local_51);
  GetFileHandle((Forth *)local_30,(Cell)this,(string *)(ulong)uVar2,(errorCodes)local_50);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  peVar3 = std::
           __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
  std::ios::clear((int)peVar3 + (int)*(undefined8 *)(*(long *)peVar3 + -0x18));
  peVar3 = std::
           __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
  std::istream::seekg((long)peVar3,
                      (_Ios_Seekdir)
                      f.
                      super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi);
  std::
  __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_30);
  std::ios::rdstate();
  std::
  __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_30);
  bVar1 = std::ios::bad();
  uVar2 = 0;
  if ((bVar1 & 1) != 0) {
    uVar2 = 0xffffffbf;
  }
  ForthStack<unsigned_int>::setTop(&this->dStack,uVar2);
  std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>::~shared_ptr
            ((shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> *)local_30);
  return;
}

Assistant:

void fileReposition() {
	REQUIRE_DSTACK_DEPTH(3, "REPOSITION-FILE");
	auto h = (dStack.getTop()); dStack.pop();
	DCell ud(dStack.getTop(1), dStack.getTop()); dStack.pop();
	auto f = GetFileHandle(h, "REPOSITION-FILE", errorFilePosition);
	f->clear();
	f->seekg(ud.data_.Dcells , std::ios_base::beg);
	auto status = f->rdstate();
	dStack.setTop(f->bad() ? Cell(errorFilePosition) : 0);
}